

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

bool __thiscall
dap::BasicTypeInfo<dap::optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_>_>::
serialize(BasicTypeInfo<dap::optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_>_>
          *this,Serializer *s,void *ptr)

{
  bool bVar1;
  void *ptr_local;
  Serializer *s_local;
  BasicTypeInfo<dap::optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_>_> *this_local
  ;
  
  bVar1 = Serializer::serialize<std::vector<dap::Source,std::allocator<dap::Source>>>
                    (s,(optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_> *)ptr);
  return bVar1;
}

Assistant:

inline bool serialize(Serializer* s, const void* ptr) const override {
    return s->serialize(*reinterpret_cast<const T*>(ptr));
  }